

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * flatbuffers::ConvertCase
                   (string *__return_storage_ptr__,string *input,Case output_case,Case input_case)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  bool is_upper;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  pointer pcVar8;
  char cVar9;
  ulong uVar10;
  byte *pbVar11;
  string s;
  string local_98;
  function<char_(char)> local_78;
  function<char_(char)> local_58;
  
  if (output_case == kKeep) {
switchD_0016460f_caseD_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = (input->_M_dataplus)._M_p;
    uVar7 = input->_M_string_length;
LAB_001645be:
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar8,pcVar8 + uVar7);
    return __return_storage_ptr__;
  }
  if (input_case - kUpperCamel < 2) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        pbVar11 = (byte *)(input->_M_dataplus)._M_p;
        if (uVar7 == 0) {
LAB_001646a2:
          tolower((uint)*pbVar11);
        }
        else {
          iVar5 = (int)(char)pbVar11[uVar7];
          if ((iVar5 != 0x5f) && (iVar3 = islower(iVar5), iVar3 == 0)) {
            bVar2 = pbVar11[uVar7 - 1];
            iVar3 = islower((int)(char)bVar2);
            if ((iVar3 != 0) || ((0xfffffff5 < (int)(char)bVar2 - 0x3aU && (9 < iVar5 - 0x30U)))) {
              std::__cxx11::string::push_back((char)&local_98);
            }
            pbVar11 = (byte *)((input->_M_dataplus)._M_p + uVar7);
            goto LAB_001646a2;
          }
        }
        std::__cxx11::string::push_back((char)&local_98);
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    ConvertCase(__return_storage_ptr__,&local_98,output_case,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
LAB_00164766:
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
    return __return_storage_ptr__;
  }
  if (input_case == kDasher) {
    paVar1 = &local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)paVar1;
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        if ((input->_M_dataplus)._M_p[uVar7] == '-') {
          std::__cxx11::string::append((char *)&local_98);
        }
        else {
          std::__cxx11::string::push_back((char)&local_98);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    ConvertCase(__return_storage_ptr__,&local_98,output_case,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_00164766;
  }
  if (input_case == kKeep) {
    puts("WARNING: Converting from kKeep case.");
  }
  cVar9 = (char)__return_storage_ptr__;
  switch(output_case) {
  case kUpperCamel:
    is_upper = true;
    goto LAB_0016488a;
  case kLowerCamel:
    is_upper = false;
LAB_0016488a:
    anon_unknown_1::ToCamelCase(__return_storage_ptr__,input,is_upper);
    break;
  default:
    goto switchD_0016460f_caseD_3;
  case kScreamingSnake:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        pbVar11 = (byte *)(input->_M_dataplus)._M_p;
        if (uVar7 == 0) {
LAB_0016490e:
          uVar6 = (uint)*pbVar11;
LAB_00164911:
          toupper(uVar6 & 0xff);
        }
        else {
          uVar6 = (uint)(char)pbVar11[uVar7];
          if (uVar6 != 0x5f) {
            iVar5 = islower(uVar6);
            if (iVar5 == 0) {
              bVar2 = pbVar11[uVar7 - 1];
              iVar5 = islower((int)(char)bVar2);
              if ((iVar5 != 0) || ((0xfffffff5 < (int)(char)bVar2 - 0x3aU && (9 < uVar6 - 0x30)))) {
                std::__cxx11::string::push_back(cVar9);
              }
              pbVar11 = (byte *)((input->_M_dataplus)._M_p + uVar7);
              goto LAB_0016490e;
            }
            goto LAB_00164911;
          }
        }
        std::__cxx11::string::push_back(cVar9);
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    break;
  case kAllUpper:
    local_58.super__Function_base._M_functor._8_8_ = 0;
    local_58.super__Function_base._M_functor._M_unused._M_object = CharToUpper;
    local_58._M_invoker = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_58.super__Function_base._M_manager =
         std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,&local_58);
    if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.super__Function_base._M_manager)
                ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    }
    break;
  case kAllLower:
    local_78.super__Function_base._M_functor._8_8_ = 0;
    local_78.super__Function_base._M_functor._M_unused._M_object = CharToLower;
    local_78._M_invoker = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_78.super__Function_base._M_manager =
         std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,&local_78);
    if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.super__Function_base._M_manager)
                ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
    }
    break;
  case kDasher:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar7 = input->_M_string_length;
    if (uVar7 != 0) {
      cVar4 = '\0';
      uVar10 = 0;
      do {
        pcVar8 = (input->_M_dataplus)._M_p;
        if (pcVar8[uVar10] == '_') {
          if (((uVar10 != 0) && (cVar4 != '/')) &&
             ((uVar7 <= uVar10 + 1 || (9 < (int)pcVar8[uVar10 + 1] - 0x30U)))) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar9);
        }
        cVar4 = pcVar8[uVar10];
        uVar10 = uVar10 + 1;
        uVar7 = input->_M_string_length;
      } while (uVar10 < uVar7);
    }
    break;
  case kSnake2:
    uVar7 = input->_M_string_length;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (1 < uVar7) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      if (input->_M_string_length != 1) {
        uVar7 = 0;
        do {
          pcVar8 = (input->_M_dataplus)._M_p;
          if ((pcVar8[uVar7] != '_') || (9 < (int)pcVar8[uVar7 + 1] - 0x30U)) {
            std::__cxx11::string::push_back(cVar9);
            pcVar8 = (input->_M_dataplus)._M_p;
            if ((int)pcVar8[uVar7] - 0x30U < 10) {
              iVar3 = (int)pcVar8[uVar7 + 1];
              iVar5 = isalpha(iVar3);
              if ((iVar5 != 0) && (iVar5 = islower(iVar3), iVar5 != 0)) {
                std::__cxx11::string::push_back(cVar9);
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < input->_M_string_length - 1);
      }
      std::__cxx11::string::push_back(cVar9);
      return __return_storage_ptr__;
    }
    pcVar8 = (input->_M_dataplus)._M_p;
    goto LAB_001645be;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertCase(const std::string &input, Case output_case,
                        Case input_case) {
  if (output_case == Case::kKeep) return input;
  // The output cases expect snake_case inputs, so if we don't have that input
  // format, try to convert to snake_case.
  switch (input_case) {
    case Case::kLowerCamel:
    case Case::kUpperCamel:
      return ConvertCase(CamelToSnake(input), output_case);
    case Case::kDasher: return ConvertCase(DasherToSnake(input), output_case);
    case Case::kKeep: printf("WARNING: Converting from kKeep case.\n"); break;
    default:
    case Case::kSnake:
    case Case::kScreamingSnake:
    case Case::kAllLower:
    case Case::kAllUpper: break;
  }

  switch (output_case) {
    case Case::kUpperCamel: return ToCamelCase(input, true);
    case Case::kLowerCamel: return ToCamelCase(input, false);
    case Case::kSnake: return input;
    case Case::kScreamingSnake: return ToSnakeCase(input, true);
    case Case::kAllUpper: return ToAll(input, CharToUpper);
    case Case::kAllLower: return ToAll(input, CharToLower);
    case Case::kDasher: return ToDasher(input);
    case Case::kSnake2: return SnakeToSnake2(input);
    default:
    case Case::kUnknown: return input;
  }
}